

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_idict_remove(stb_idict *a,stb_int32 k,stb_int32 *v)

{
  stb__stb_idict__hashpair *psVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (k == 3) {
    if (a->has_del == '\0') {
      return 0;
    }
    if (v != (stb_int32 *)0x0) {
      *v = a->dv;
    }
    a->has_del = '\0';
  }
  else if (k == 1) {
    if (a->has_empty == '\0') {
      return 0;
    }
    if (v != (stb_int32 *)0x0) {
      *v = a->ev;
    }
    a->has_empty = '\0';
  }
  else {
    iVar2 = ((uint)k >> 0x13) + ((uint)k >> 6) + k;
    uVar3 = iVar2 * 0x80008 ^ iVar2 * 0x10001;
    uVar3 = (uVar3 >> 5) + uVar3;
    uVar3 = uVar3 * 4 ^ uVar3;
    uVar3 = (uVar3 >> 0xf) + uVar3;
    uVar3 = uVar3 * 0x400 ^ uVar3;
    uVar3 = (uVar3 >> 0x13) + (uVar3 >> 6) + uVar3;
    uVar4 = a->mask & uVar3;
    uVar5 = (ulong)uVar4;
    psVar1 = a->table;
    if (psVar1[uVar4].k == 1) {
      return 0;
    }
    if (psVar1[uVar4].k != k) {
      do {
        uVar5 = (ulong)((int)uVar5 + ((uVar3 >> 0x13) + (uVar3 >> 6) + uVar3 | 1) & a->mask);
        if (psVar1[uVar5].k == 1) {
          return 0;
        }
      } while (psVar1[uVar5].k != k);
    }
    psVar1[uVar5].k = 3;
    a->count = a->count + -1;
    a->deleted = a->deleted + 1;
    if (v != (stb_int32 *)0x0) {
      *v = psVar1[uVar5].v;
    }
    if (a->shrink_threshhold <= a->count) {
      if (a->delete_threshhold < a->deleted) {
        stb__stb_idict_rehash(a,a->limit);
        return 1;
      }
      return 1;
    }
    stb__stb_idict_rehash(a,a->limit >> 1);
  }
  return 1;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}